

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper3.cpp
# Opt level: O2

void test_cpp_wrapper_range_exist_single(planck_unit_test_t *tc,Dictionary<int,_int> *dict)

{
  long lVar1;
  int expected_records [2];
  
  expected_records[0] = 0x19;
  expected_records[1] = 0x32;
  for (lVar1 = 0; lVar1 != 0x14; lVar1 = lVar1 + 4) {
    cpp_wrapper_insert(tc,dict,*(int *)((long)&DAT_001145c0 + lVar1),
                       *(int *)((long)&DAT_001145c0 + lVar1),'\x01');
  }
  cpp_wrapper_range(tc,dict,0xf,0x37,expected_records,2,'\x01');
  return;
}

Assistant:

void
test_cpp_wrapper_range_exist_single(
	planck_unit_test_t *tc,
	Dictionary<int, int> *dict
) {
	int records[5]			= { 3, 10, 25, 50, 70 };
	int expected_records[2] = { 25, 50 };
	int records_length		= sizeof(records) / sizeof(int);

	for (int i = 0; i < records_length; i++) {
		cpp_wrapper_insert(tc, dict, records[i], records[i], boolean_true);
	}

	cpp_wrapper_range(tc, dict, 15, 55, expected_records, 2, boolean_true);
}